

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hrgls_internal_wrap.cpp
# Opt level: O1

hrgls_Status
hrgls_DataBlobSourceCreateParametersSetName(hrgls_DataBlobSourceCreateParams params,char *name)

{
  char *pcVar1;
  hrgls_Status hVar2;
  
  if (params == (hrgls_DataBlobSourceCreateParams)0x0) {
    hVar2 = 0x3ee;
  }
  else {
    pcVar1 = (char *)(params->name)._M_string_length;
    if (name == (char *)0x0) {
      name = "";
    }
    else {
      strlen(name);
    }
    hVar2 = 0;
    std::__cxx11::string::_M_replace((ulong)&params->name,0,pcVar1,(ulong)name);
  }
  return hVar2;
}

Assistant:

hrgls_Status hrgls_DataBlobSourceCreateParametersSetName(
    hrgls_DataBlobSourceCreateParams params, const char *name)
  {
    hrgls_Status s = hrgls_STATUS_OKAY;
    if (!params) {
      return hrgls_STATUS_NULL_OBJECT_POINTER;
    }
    if (!name) {
      params->name = "";
    } else {
      params->name = name;
    }
    return s;
  }